

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_error qpdf_get_error(qpdf_data qpdf)

{
  element_type *peVar1;
  shared_ptr<QPDFExc> local_28;
  qpdf_data local_18;
  qpdf_data qpdf_local;
  
  local_18 = qpdf;
  peVar1 = std::__shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(qpdf->error).super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>);
  if (peVar1 == (element_type *)0x0) {
    qpdf_local = (qpdf_data)0x0;
  }
  else {
    std::shared_ptr<QPDFExc>::operator=(&(local_18->tmp_error).exc,&local_18->error);
    std::shared_ptr<QPDFExc>::shared_ptr(&local_28,(nullptr_t)0x0);
    std::shared_ptr<QPDFExc>::operator=(&local_18->error,&local_28);
    std::shared_ptr<QPDFExc>::~shared_ptr(&local_28);
    QTC::TC("qpdf","qpdf-c qpdf_get_error returned error",0);
    qpdf_local = (qpdf_data)&local_18->tmp_error;
  }
  return (qpdf_error)qpdf_local;
}

Assistant:

qpdf_error
qpdf_get_error(qpdf_data qpdf)
{
    if (qpdf->error.get()) {
        qpdf->tmp_error.exc = qpdf->error;
        qpdf->error = nullptr;
        QTC::TC("qpdf", "qpdf-c qpdf_get_error returned error");
        return &qpdf->tmp_error;
    } else {
        return nullptr;
    }
}